

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  UnitTest *pUVar2;
  char *pcVar3;
  string *psVar4;
  string *in_RDI;
  string local_240 [32];
  FilePath local_220;
  undefined1 local_200 [8];
  FilePath result;
  string local_1d8;
  FilePath local_1b8;
  allocator local_191;
  string local_190;
  FilePath local_170;
  FilePath local_150;
  allocator local_129;
  string local_128;
  undefined1 local_108 [8];
  FilePath output_name;
  string local_e0;
  FilePath local_c0;
  allocator local_99;
  string local_98;
  FilePath local_78;
  FilePath local_58;
  char *local_38;
  char *colon;
  allocator local_19;
  char *local_18;
  char *gtest_output_flag;
  
  local_18 = (char *)std::__cxx11::string::c_str();
  if (local_18 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    local_38 = strchr(local_18,0x3a);
    if (local_38 == (char *)0x0) {
      pUVar2 = UnitTest::GetInstance();
      pcVar3 = UnitTest::original_working_dir(pUVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_98,pcVar3,&local_99);
      FilePath::FilePath(&local_78,&local_98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e0,"test_detail.xml",
                 (allocator *)(output_name.pathname_.field_2._M_local_buf + 0xf));
      FilePath::FilePath(&local_c0,&local_e0);
      FilePath::ConcatPaths(&local_58,&local_78,&local_c0);
      psVar4 = FilePath::string_abi_cxx11_(&local_58);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar4);
      FilePath::~FilePath(&local_58);
      FilePath::~FilePath(&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator
                ((allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
      FilePath::~FilePath(&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    else {
      pcVar3 = local_38 + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_128,pcVar3,&local_129);
      FilePath::FilePath((FilePath *)local_108,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      bVar1 = FilePath::IsAbsolutePath((FilePath *)local_108);
      if (!bVar1) {
        pUVar2 = UnitTest::GetInstance();
        pcVar3 = UnitTest::original_working_dir(pUVar2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_190,pcVar3,&local_191);
        FilePath::FilePath(&local_170,&local_190);
        pcVar3 = local_38 + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1d8,pcVar3,
                   (allocator *)(result.pathname_.field_2._M_local_buf + 0xf));
        FilePath::FilePath(&local_1b8,&local_1d8);
        FilePath::ConcatPaths(&local_150,&local_170,&local_1b8);
        FilePath::operator=((FilePath *)local_108,&local_150);
        FilePath::~FilePath(&local_150);
        FilePath::~FilePath(&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
        FilePath::~FilePath(&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator((allocator<char> *)&local_191);
      }
      bVar1 = FilePath::IsDirectory((FilePath *)local_108);
      if (bVar1) {
        GetCurrentExecutableName();
        GetOutputFormat_abi_cxx11_();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        FilePath::GenerateUniqueFileName
                  ((FilePath *)local_200,(FilePath *)local_108,&local_220,pcVar3);
        std::__cxx11::string::~string(local_240);
        FilePath::~FilePath(&local_220);
        psVar4 = FilePath::string_abi_cxx11_((FilePath *)local_200);
        std::__cxx11::string::string((string *)in_RDI,(string *)psVar4);
        result.pathname_.field_2._8_4_ = 1;
        FilePath::~FilePath((FilePath *)local_200);
      }
      else {
        psVar4 = FilePath::string_abi_cxx11_((FilePath *)local_108);
        std::__cxx11::string::string((string *)in_RDI,(string *)psVar4);
        result.pathname_.field_2._8_4_ = 1;
      }
      FilePath::~FilePath((FilePath *)local_108);
    }
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return "";

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return internal::FilePath::ConcatPaths(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile)).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}